

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O1

void advance_engine<trng::mt19937>(mt19937 *r1,mt19937 *r2,long N)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  
  if (0 < N) {
    lVar2 = 0;
    do {
      if (0x26f < (r1->S).mti) {
        lVar3 = 0;
        do {
          uVar1 = (r1->S).mt[lVar3 + 1];
          (r1->S).mt[lVar3] =
               *(uint *)(&DAT_002a8ffc + (ulong)(uVar1 & 1) * 4) ^ (r1->S).mt[lVar3 + 0x18d] ^
               (uVar1 & 0x7ffffffe | (r1->S).mt[lVar3] & 0x80000000) >> 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0xe3);
        lVar3 = 0;
        do {
          uVar1 = (r1->S).mt[lVar3 + 0xe4];
          (r1->S).mt[lVar3 + 0xe3] =
               *(uint *)(&DAT_002a8ffc + (ulong)(uVar1 & 1) * 4) ^ (r1->S).mt[lVar3] ^
               (uVar1 & 0x7ffffffe | (r1->S).mt[lVar3 + 0xe3] & 0x80000000) >> 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x18c);
        uVar1 = (r1->S).mt[0];
        (r1->S).mt[0x26f] =
             *(uint *)(&DAT_002a8ffc + (ulong)(uVar1 & 1) * 4) ^ (r1->S).mt[0x18c] ^
             (uVar1 & 0x7ffffffe | (r1->S).mt[0x26f] & 0x80000000) >> 1;
        (r1->S).mti = 0;
      }
      (r1->S).mti = (r1->S).mti + 1;
      if (0x26f < (r2->S).mti) {
        lVar3 = 0;
        do {
          uVar1 = (r2->S).mt[lVar3 + 1];
          (r2->S).mt[lVar3] =
               *(uint *)(&DAT_002a8ffc + (ulong)(uVar1 & 1) * 4) ^ (r2->S).mt[lVar3 + 0x18d] ^
               (uVar1 & 0x7ffffffe | (r2->S).mt[lVar3] & 0x80000000) >> 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0xe3);
        lVar3 = 0;
        do {
          uVar1 = (r2->S).mt[lVar3 + 0xe4];
          (r2->S).mt[lVar3 + 0xe3] =
               *(uint *)(&DAT_002a8ffc + (ulong)(uVar1 & 1) * 4) ^ (r2->S).mt[lVar3] ^
               (uVar1 & 0x7ffffffe | (r2->S).mt[lVar3 + 0xe3] & 0x80000000) >> 1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x18c);
        uVar1 = (r2->S).mt[0];
        (r2->S).mt[0x26f] =
             *(uint *)(&DAT_002a8ffc + (ulong)(uVar1 & 1) * 4) ^ (r2->S).mt[0x18c] ^
             (uVar1 & 0x7ffffffe | (r2->S).mt[0x26f] & 0x80000000) >> 1;
        (r2->S).mti = 0;
      }
      (r2->S).mti = (r2->S).mti + 1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != N);
  }
  return;
}

Assistant:

void advance_engine(R &r1, R &r2, const long N) {
  for (long i{0}; i < N; ++i) {
    r1();
    r2();
  }
}